

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

void __thiscall
alex::Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
create_two_new_data_nodes
          (Alex<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
           *this,data_node_type *old_node,model_node_type *parent,int duplication_factor,
          bool reuse_model,int start_bucketID)

{
  double dVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  uint uVar5;
  int right;
  int iVar6;
  int iVar7;
  data_node_type *left_leaf;
  data_node_type *right_leaf;
  uint8_t uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double local_38;
  
  if (duplication_factor < 1) {
    __assert_fail("duplication_factor >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/benchmark/../core/alex.h"
                  ,0x69d,
                  "void alex::Alex<double, double>::create_two_new_data_nodes(data_node_type *, model_node_type *, int, bool, int) [T = double, P = double, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<double, double>>, allow_duplicates = true]"
                 );
  }
  iVar3 = 1 << (duplication_factor & 0x1fU);
  iVar9 = iVar3 + start_bucketID;
  dVar1 = (parent->super_AlexNode<double,_double>).model_.b_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar1;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = old_node->max_key_;
  uVar11 = parent->num_children_ - 1;
  iVar3 = iVar3 / 2 + start_bucketID;
  dVar13 = (double)old_node->num_right_out_of_bounds_inserts_ / (double)old_node->num_inserts_;
  local_38 = (parent->super_AlexNode<double,_double>).model_.a_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_38;
  auVar20 = vfmadd213sd_fma(auVar20,auVar14,auVar19);
  dVar16 = (double)old_node->num_left_out_of_bounds_inserts_ / (double)old_node->num_inserts_;
  uVar4 = ~((int)auVar20._0_8_ >> 0x1f) & (int)auVar20._0_8_;
  if ((int)uVar11 < (int)uVar4) {
    uVar4 = uVar11;
  }
  auVar17._8_8_ = 0;
  auVar17._0_8_ = old_node->min_key_;
  auVar20 = vfmadd213sd_fma(auVar17,auVar14,auVar19);
  uVar5 = ~((int)auVar20._0_8_ >> 0x1f) & (int)auVar20._0_8_;
  if ((int)uVar5 <= (int)uVar11) {
    uVar11 = uVar5;
  }
  local_38 = ((double)iVar3 - dVar1) / local_38;
  right = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
          ::lower_bound<double>(old_node,&local_38);
  iVar6 = old_node->data_capacity_;
  while (right < iVar6) {
    dVar1 = old_node->key_slots_[right];
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar1;
    if (((dVar1 == 1.79769313486232e+308) && (!NAN(dVar1))) ||
       (auVar18._8_8_ = 0, auVar18._0_8_ = (parent->super_AlexNode<double,_double>).model_.a_,
       auVar2._8_8_ = 0, auVar2._0_8_ = (parent->super_AlexNode<double,_double>).model_.b_,
       auVar20 = vfmadd213sd_fma(auVar15,auVar18,auVar2), iVar3 <= (int)auVar20._0_8_)) break;
    iVar7 = AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
            ::get_next_filled_position(old_node,right,false);
    iVar6 = old_node->data_capacity_;
    right = iVar7 + 1;
    if (iVar6 < iVar7 + 1) {
      right = iVar6;
    }
  }
  left_leaf = bulk_load_leaf_node_from_existing
                        (this,old_node,0,right,true,(FTNode *)0x0,reuse_model,
                         (start_bucketID <= (int)uVar4 && (int)uVar4 < iVar3) && 0.9 < dVar13,
                         (start_bucketID <= (int)uVar11 && (int)uVar11 < iVar3) && 0.9 < dVar16);
  right_leaf = bulk_load_leaf_node_from_existing
                         (this,old_node,right,old_node->data_capacity_,true,(FTNode *)0x0,
                          reuse_model,
                          (bool)(~(dVar13 <= 0.9 || (int)uVar4 < iVar3) & (int)uVar4 < iVar9),
                          (bool)(~(dVar16 <= 0.9 || (int)uVar11 < iVar3) & (int)uVar11 < iVar9));
  (left_leaf->super_AlexNode<double,_double>).level_ =
       (parent->super_AlexNode<double,_double>).level_ + 1;
  (right_leaf->super_AlexNode<double,_double>).level_ =
       (parent->super_AlexNode<double,_double>).level_ + 1;
  uVar8 = (char)duplication_factor + 0xff;
  (left_leaf->super_AlexNode<double,_double>).duplication_factor_ = uVar8;
  (right_leaf->super_AlexNode<double,_double>).duplication_factor_ = uVar8;
  lVar10 = (long)iVar3;
  for (lVar12 = (long)start_bucketID; lVar12 < lVar10; lVar12 = lVar12 + 1) {
    parent->children_[lVar12] = &left_leaf->super_AlexNode<double,_double>;
  }
  for (; lVar10 < iVar9; lVar10 = lVar10 + 1) {
    parent->children_[lVar10] = &right_leaf->super_AlexNode<double,_double>;
  }
  link_data_nodes(this,old_node,left_leaf,right_leaf);
  return;
}

Assistant:

void create_two_new_data_nodes(data_node_type* old_node,
                                 model_node_type* parent,
                                 int duplication_factor, bool reuse_model,
                                 int start_bucketID = 0) {
    assert(duplication_factor >= 1);
    int num_buckets = 1 << duplication_factor;
    int end_bucketID = start_bucketID + num_buckets;
    int mid_bucketID = start_bucketID + num_buckets / 2;

    bool append_mostly_right = old_node->is_append_mostly_right();
    int appending_right_bucketID = std::min<int>(
        std::max<int>(parent->model_.predict(old_node->max_key_), 0),
        parent->num_children_ - 1);
    bool append_mostly_left = old_node->is_append_mostly_left();
    int appending_left_bucketID = std::min<int>(
        std::max<int>(parent->model_.predict(old_node->min_key_), 0),
        parent->num_children_ - 1);

    int right_boundary = old_node->lower_bound(
        (mid_bucketID - parent->model_.b_) / parent->model_.a_);
    // Account for off-by-one errors due to floating-point precision issues.
    while (right_boundary < old_node->data_capacity_ &&
           old_node->get_key(right_boundary) != data_node_type::kEndSentinel_ &&
           parent->model_.predict(old_node->get_key(right_boundary)) <
               mid_bucketID) {
      right_boundary = std::min(
          old_node->get_next_filled_position(right_boundary, false) + 1,
          old_node->data_capacity_);
    }
    data_node_type* left_leaf = bulk_load_leaf_node_from_existing(
        old_node, 0, right_boundary, true, nullptr, reuse_model,
        append_mostly_right && start_bucketID <= appending_right_bucketID &&
            appending_right_bucketID < mid_bucketID,
        append_mostly_left && start_bucketID <= appending_left_bucketID &&
            appending_left_bucketID < mid_bucketID);
    data_node_type* right_leaf = bulk_load_leaf_node_from_existing(
        old_node, right_boundary, old_node->data_capacity_, true, nullptr,
        reuse_model,
        append_mostly_right && mid_bucketID <= appending_right_bucketID &&
            appending_right_bucketID < end_bucketID,
        append_mostly_left && mid_bucketID <= appending_left_bucketID &&
            appending_left_bucketID < end_bucketID);
    left_leaf->level_ = static_cast<short>(parent->level_ + 1);
    right_leaf->level_ = static_cast<short>(parent->level_ + 1);
    left_leaf->duplication_factor_ =
        static_cast<uint8_t>(duplication_factor - 1);
    right_leaf->duplication_factor_ =
        static_cast<uint8_t>(duplication_factor - 1);

    for (int i = start_bucketID; i < mid_bucketID; i++) {
      parent->children_[i] = left_leaf;
    }
    for (int i = mid_bucketID; i < end_bucketID; i++) {
      parent->children_[i] = right_leaf;
    }
    link_data_nodes(old_node, left_leaf, right_leaf);
  }